

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

void exit_cb(uv_process_t *process,int64_t exit_status,int term_signal)

{
  long lVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int64_t eval_b;
  int64_t eval_a;
  
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if (exit_status == 0) {
    if (term_signal == 0) {
      uv_close((uv_handle_t *)process,close_cb);
      uv_close((uv_handle_t *)&in,close_cb);
      uv_close((uv_handle_t *)&out,close_cb);
      return;
    }
  }
  else {
    exit_cb_cold_1();
  }
  exit_cb_cold_2();
  lVar1 = (long)output_used;
  *(char **)CONCAT44(extraout_var,extraout_EDX) = output + lVar1;
  *(long *)(CONCAT44(extraout_var,extraout_EDX) + 8) = 0x400 - lVar1;
  return;
}

Assistant:

static void exit_cb(uv_process_t* process,
                    int64_t exit_status,
                    int term_signal) {
  printf("exit_cb\n");
  exit_cb_called++;
  ASSERT_EQ(1, exit_status);
  ASSERT_OK(term_signal);
  uv_close((uv_handle_t*) process, close_cb);
}